

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O3

int ion_map_fd(int fd,ion_user_handle_t handle,int *map_fd)

{
  int iVar1;
  ion_fd_data data;
  ion_user_handle_t local_10;
  int local_c;
  
  local_c = 0;
  iVar1 = -0x16;
  if (map_fd != (int *)0x0) {
    local_10 = handle;
    iVar1 = ion_ioctl(fd,-0x3ff7b6fe,&local_10);
    if (-1 < iVar1) {
      *map_fd = local_c;
      iVar1 = 0;
      if (local_c < 0) {
        _mpp_log_l(2,"mpp_ion","map ioctl returned negative fd\n",(char *)0x0);
        iVar1 = -0x16;
      }
    }
  }
  return iVar1;
}

Assistant:

static int ion_map_fd(int fd, ion_user_handle_t handle, int *map_fd)
{
    int ret;
    struct ion_fd_data data = {
        .handle = handle,
    };

    if (map_fd == NULL)
        return -EINVAL;

    ret = ion_ioctl(fd, ION_IOC_MAP, &data);
    if (ret < 0)
        return ret;

    *map_fd = data.fd;
    if (*map_fd < 0) {
        mpp_err("map ioctl returned negative fd\n");
        return -EINVAL;
    }

    return 0;
}